

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

char * serilizeRr(DNSRr *dnsRr,int *length)

{
  uint16_t uVar1;
  uint32_t uVar2;
  in_addr_t iVar3;
  char *__s;
  size_t sVar4;
  char *__dest;
  uint16_t *puVar5;
  uint16_t *puVar6;
  in_addr_t *local_40;
  char *ptr;
  char *result;
  char *formatedData;
  int dataLength;
  char *formatedName;
  int *length_local;
  DNSRr *dnsRr_local;
  
  __s = toInternetFormat(dnsRr->name);
  if (dnsRr->type == 1) {
    formatedData._4_4_ = 4;
  }
  else {
    result = toInternetFormat(dnsRr->data);
    sVar4 = strlen(result);
    formatedData._4_4_ = (int)sVar4;
  }
  sVar4 = strlen(__s);
  __dest = (char *)malloc(sVar4 + (long)formatedData._4_4_ + 0xe);
  checkMalloc(__dest);
  strcpy(__dest,__s);
  sVar4 = strlen(__s);
  puVar5 = (uint16_t *)(__dest + sVar4 + 1);
  free(__s);
  uVar1 = htons(dnsRr->type);
  *puVar5 = uVar1;
  uVar1 = htons(dnsRr->class);
  puVar5[1] = uVar1;
  uVar2 = htonl(dnsRr->ttl);
  *(uint32_t *)(puVar5 + 2) = uVar2;
  puVar6 = puVar5 + 4;
  uVar1 = (uint16_t)formatedData._4_4_;
  if (dnsRr->type == 0xf) {
    uVar1 = htons(uVar1 + 3);
    *puVar6 = uVar1;
    uVar1 = htons(5);
    puVar5[5] = uVar1;
    local_40 = (in_addr_t *)(puVar5 + 6);
  }
  else {
    if (dnsRr->type == 1) {
      uVar1 = htons(uVar1);
      *puVar6 = uVar1;
    }
    else {
      uVar1 = htons(uVar1 + 1);
      *puVar6 = uVar1;
    }
    local_40 = (in_addr_t *)(puVar5 + 5);
  }
  if (dnsRr->type == 1) {
    iVar3 = inet_addr(dnsRr->data);
    *local_40 = iVar3;
  }
  else {
    memcpy(local_40,result,(long)(formatedData._4_4_ + 1));
    free(result);
  }
  *length = ((int)local_40 + formatedData._4_4_ + 1) - (int)__dest;
  return __dest;
}

Assistant:

char *serilizeRr(DNSRr *dnsRr, int *length)
{

    char *formatedName = toInternetFormat(dnsRr->name);
    int dataLength = 0;
    char *formatedData;
    if (dnsRr->type == T_A)
    {
        dataLength = 4;
    } else
    {
        formatedData = toInternetFormat(dnsRr->data);
        dataLength = strlen(formatedData);
    }
    char *result = (char *) malloc(strlen(formatedName) + dataLength + 4 + 4 + 2 + 2 + 2);
    checkMalloc(result);

    char *ptr = result;
    strcpy(ptr, formatedName);

    ptr += strlen(formatedName) + 1;
    free(formatedName);
    *(unsigned short *) ptr = htons(dnsRr->type);
    ptr += 2;
    *(unsigned short *) ptr = htons(dnsRr->class);
    ptr += 2;
    *(unsigned int *) ptr = htonl(dnsRr->ttl);

    ptr += 4;


    if (dnsRr->type == T_MX)
    {
        *(unsigned short *) ptr = htons(dataLength + 3);
        ptr += 2;
        *(unsigned short *) ptr = htons(0x05);
        ptr += 2;
    } else if (dnsRr->type == T_A)
    {
        *(unsigned short *) ptr = htons(dataLength);
        ptr += 2;
    } else
    {
        *(unsigned short *) ptr = htons(dataLength + 1);
        ptr += 2;
    }

    if (dnsRr->type == T_A)
    {
        *(unsigned int *) ptr = inet_addr(dnsRr->data);

    } else
    {
        memcpy(ptr, formatedData, dataLength + 1);
        free(formatedData);
    }
    ptr += dataLength + 1;

    *length = ptr - result;
    return result;
}